

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_6c49c::data<float>::setUpFrameBuffer
          (data<float> *this,vector<float,_std::allocator<float>_> *data,FrameBuffer *framebuf,
          Box2i *dw,bool dontbotherloadingdepth)

{
  PixelType PVar1;
  int iVar2;
  int iVar3;
  pointer pbVar4;
  long lVar5;
  Box2i *pBVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  pointer pbVar11;
  ulong uVar12;
  Box<Imath_3_2::Vec2<int>_> local_a0;
  FrameBuffer *local_90;
  Box2i *local_88;
  Slice *local_80;
  long local_78;
  undefined1 local_70 [8];
  Box<Imath_3_2::Vec2<int>_> local_68 [3];
  
  pbVar11 = (this->_channels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = (this->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_90 = framebuf;
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size((Box<Imath_3_2::Vec2<int>_> *)(local_70 + 8));
  local_88 = dw;
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(&local_a0);
  local_a0.max = (Vec2<int>)data;
  std::vector<float,_std::allocator<float>_>::resize
            (data,((long)local_a0.min.y + 1) * ((long)local_68[0].min.x + 1) *
                  ((long)pbVar11 - (long)pbVar4 >> 5));
  pBVar6 = local_88;
  lVar10 = 0;
  lVar9 = 0;
  uVar12 = 0;
  do {
    pbVar11 = (this->_channels).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_channels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <= uVar12) {
      return;
    }
    if (dontbotherloadingdepth) {
      bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pbVar11->_M_dataplus)._M_p + lVar9),"Z");
      if ((bVar7) &&
         (bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((this->_channels).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar9),"ZBack"), bVar7)) {
        pbVar11 = (this->_channels).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_001322e4;
      }
    }
    else {
LAB_001322e4:
      lVar5 = *(long *)local_a0.max;
      local_80 = *(Slice **)((long)&(pbVar11->_M_dataplus)._M_p + lVar9);
      PVar1 = this->_type;
      iVar2 = (pBVar6->min).x;
      iVar3 = (pBVar6->min).y;
      local_78 = lVar9;
      Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(&local_a0);
      iVar8 = local_a0.min.x + 1;
      lVar9 = (long)(this->_channels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_channels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size((Box<Imath_3_2::Vec2<int>_> *)local_70);
      Imf_3_4::Slice::Slice
                ((Slice *)(local_70 + 8),PVar1,
                 (char *)(lVar5 + (lVar9 >> 5) * (long)(iVar8 * iVar3 + iVar2) * -4 + lVar10),
                 lVar9 >> 3,
                 ((long)(this->_channels).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_channels).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) *
                 ((long)(int)local_70._0_4_ + 1) * 4,1,1,0.0,false,false);
      lVar9 = local_78;
      Imf_3_4::FrameBuffer::insert((char *)local_90,local_80);
    }
    uVar12 = uVar12 + 1;
    lVar9 = lVar9 + 0x20;
    lVar10 = lVar10 + 4;
  } while( true );
}

Assistant:

void setUpFrameBuffer (
        vector<T>&   data,
        FrameBuffer& framebuf,
        const Box2i& dw,
        bool         dontbotherloadingdepth) const
    {

        // allocate enough space for all channels (even the depth channel)
        data.resize (
            _channels.size () * (dw.size ().x + 1) * (dw.size ().y + 1));
        for (size_t i = 0; i < _channels.size (); i++)
        {
            if (!dontbotherloadingdepth ||
                (_channels[i] != "Z" && _channels[i] != "ZBack"))
            {
                intptr_t base = reinterpret_cast<intptr_t> (&data[i]);
                framebuf.insert (
                    _channels[i].c_str (),
                    Slice (
                        _type,
                        reinterpret_cast<char*> (
                            base -
                            sizeof (T) *
                                (dw.min.x + dw.min.y * (dw.size ().x + 1)) *
                                _channels.size ()),
                        sizeof (T) * _channels.size (),
                        sizeof (T) * (dw.size ().x + 1) * _channels.size ()));
            }
        }
    }